

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

void __thiscall kj::HttpServer::Connection::~Connection(Connection *this)

{
  uint *puVar1;
  HttpServer *pHVar2;
  PromiseFulfiller<void> *pPVar3;
  undefined1 local_11;
  
  pHVar2 = this->server;
  puVar1 = &pHVar2->connectionCount;
  *puVar1 = *puVar1 - 1;
  if ((*puVar1 == 0) &&
     (pPVar3 = (pHVar2->zeroConnectionsFulfiller).ptr.ptr, pPVar3 != (PromiseFulfiller<void> *)0x0))
  {
    (*(pPVar3->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar3,&local_11);
  }
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::dispose(&(this->tunnelWriteGuard).ptr);
  kj::_::NullableValue<kj::Promise<kj::HttpServer::Connection::LoopResult>_>::~NullableValue
            (&(this->tunnelRejected).ptr);
  kj::_::NullableValue<kj::Promise<kj::HttpServer::Connection::LoopResult>_>::~NullableValue
            (&(this->webSocketError).ptr);
  if (((this->currentMethod).ptr.isSet == true) &&
     ((this->currentMethod).ptr.field_1.value.tag - 1 < 2)) {
    (this->currentMethod).ptr.field_1.value.tag = 0;
  }
  anon_unknown_36::HttpOutputStream::~HttpOutputStream(&this->httpOutput);
  anon_unknown_36::HttpInputStreamImpl::~HttpInputStreamImpl(&this->httpInput);
  Own<kj::Function<kj::Maybe<kj::Own<kj::HttpService,_std::nullptr_t>_>_(kj::HttpServer::SuspendableRequest_&)>::Iface,_std::nullptr_t>
  ::dispose(&(this->factory).impl);
  return;
}

Assistant:

~Connection() noexcept(false) {
    if (--server.connectionCount == 0) {
      KJ_IF_SOME(f, server.zeroConnectionsFulfiller) {
        f->fulfill();
      }
    }
  }